

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

void Super_AddGateToTable(Super_Man_t *pMan,Super_Gate_t_conflict *pGate)

{
  int iVar1;
  char **in_RAX;
  Super_Gate_t_conflict **ppList;
  char **local_18;
  
  local_18 = in_RAX;
  iVar1 = stmm_find_or_add(pMan->tTable,(char *)(ulong)(pGate->uTruth[1] ^ pGate->uTruth[0]),
                           &local_18);
  if (iVar1 == 0) {
    *local_18 = (char *)0x0;
    pMan->nClasses = pMan->nClasses + 1;
  }
  pGate->pNext = (Super_Gate_t_conflict *)*local_18;
  *local_18 = (char *)pGate;
  pMan->nAdded = pMan->nAdded + 1;
  return;
}

Assistant:

void Super_AddGateToTable( Super_Man_t * pMan, Super_Gate_t * pGate )
{
    Super_Gate_t ** ppList;
    ABC_PTRUINT_T Key;
//    Key = pGate->uTruth[0] + 2003 * pGate->uTruth[1];
    Key = pGate->uTruth[0] ^ pGate->uTruth[1];
    if ( !stmm_find_or_add( pMan->tTable, (char *)Key, (char ***)&ppList ) )
    {
        *ppList = NULL;
        pMan->nClasses++;
    }
    pGate->pNext = *ppList;
    *ppList = pGate;
    pMan->nAdded++;
}